

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall pugi::xml_node::set_name(xml_node *this,char_t *rhs)

{
  xml_node_struct *header;
  bool bVar1;
  uint uVar2;
  
  header = this->_root;
  if (((header != (xml_node_struct *)0x0) && (uVar2 = (uint)header->header & 7, uVar2 < 7)) &&
     ((0x62U >> uVar2 & 1) != 0)) {
    bVar1 = impl::anon_unknown_0::strcpy_insitu(&header->name,&header->header,0x10,rhs);
    return bVar1;
  }
  return false;
}

Assistant:

PUGI__FN bool xml_node::set_name(const char_t* rhs)
	{
		switch (type())
		{
		case node_pi:
		case node_declaration:
		case node_element:
			return impl::strcpy_insitu(_root->name, _root->header, impl::xml_memory_page_name_allocated_mask, rhs);

		default:
			return false;
		}
	}